

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

Array * __thiscall notch::core::Net::backprop(Net *this,Array *errors)

{
  bool bVar1;
  int iVar2;
  logic_error *this_00;
  size_type sVar3;
  __shared_ptr_access<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_01;
  element_type *peVar4;
  undefined4 extraout_var;
  size_t i;
  size_t back_offset;
  size_t n;
  Array *bpr;
  Array *errors_local;
  Net *this_local;
  
  bVar1 = std::
          vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
          ::empty(&this->layers);
  if (!bVar1) {
    sVar3 = std::
            vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
            ::size(&this->layers);
    n = (size_t)errors;
    for (i = 0; i < sVar3; i = i + 1) {
      this_01 = (__shared_ptr_access<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::
                   vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                   ::operator[](&this->layers,(sVar3 - 1) - i);
      peVar4 = std::
               __shared_ptr_access<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_01);
      iVar2 = (*peVar4->_vptr_ABackpropLayer[0xd])(peVar4,n);
      n = CONCAT44(extraout_var,iVar2);
    }
    return (Array *)n;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error(this_00,"no layers");
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

const Array &backprop(const Array &errors) {
        if (layers.empty()) {
            throw std::logic_error("no layers");
        }
        const Array *bpr = &errors;
        size_t n = layers.size();
        for (size_t back_offset = 0; back_offset < n; ++back_offset) {
            size_t i = n - 1 - back_offset;
            bpr = &(layers[i]->backprop(*bpr));
        }
        return *bpr;
    }